

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_WCVTP(TT_ExecContext exc,FT_Long *args)

{
  FT_ULong I;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  if ((ulong)*args < exc->cvtSize) {
    (*exc->func_write_cvt)(exc,*args,args[1]);
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_WCVTP( TT_ExecContext  exc,
             FT_Long*        args )
  {
    FT_ULong  I = (FT_ULong)args[0];


    if ( BOUNDSL( I, exc->cvtSize ) )
    {
      if ( exc->pedantic_hinting )
        ARRAY_BOUND_ERROR;
    }
    else
      exc->func_write_cvt( exc, I, args[1] );
  }